

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rga.cpp
# Opt level: O1

MPP_RET rga_init(RgaCtx *ctx)

{
  int iVar1;
  int *piVar2;
  MPP_RET MVar3;
  
  *ctx = (RgaCtx)0x0;
  piVar2 = (int *)mpp_osal_malloc("rga_init",0x130);
  if (piVar2 == (int *)0x0) {
    piVar2 = (int *)0x0;
    _mpp_log_l(2,0,"malloc context failed\n","rga_init");
    MVar3 = MPP_ERR_NULL_PTR;
  }
  else {
    MVar3 = MPP_OK;
    iVar1 = open("/dev/rga",0x80002,0);
    *piVar2 = iVar1;
    if (iVar1 < 0) {
      _mpp_log_l(2,0,"open device failed\n","rga_init");
      mpp_osal_free("rga_init",piVar2);
      MVar3 = MPP_ERR_OPEN_FILE;
      piVar2 = (int *)0x0;
    }
  }
  *ctx = piVar2;
  return MVar3;
}

Assistant:

MPP_RET rga_init(RgaCtx *ctx)
{
    MPP_RET ret = MPP_OK;
    RgaCtxImpl *impl = NULL;

    rga_dbg_func("in\n");

    *ctx = NULL;

    impl = mpp_malloc(RgaCtxImpl, 1);
    if (!impl) {
        mpp_err_f("malloc context failed\n");
        ret = MPP_ERR_NULL_PTR;
        goto END;
    }

    impl->rga_fd = open(DEFAULT_RGA_DEV, O_RDWR | O_CLOEXEC, 0);
    if (impl->rga_fd < 0) {
        mpp_err_f("open device failed\n");
        mpp_free(impl);
        impl = NULL;
        ret = MPP_ERR_OPEN_FILE;
        goto END;
    }

END:
    *ctx = impl;
    rga_dbg_func("out\n");
    return ret;
}